

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O2

int Bmcg_ManUnfold_rec(Bmcg_Man_t *p,int iObj,int f)

{
  Gia_Man_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  Gia_Obj_t *pGVar7;
  
  pvVar6 = Vec_PtrEntry(&p->vGia2Fr,f);
  iVar3 = *(int *)((long)pvVar6 + (long)iObj * 4);
  if (-1 < iVar3) {
    return iVar3;
  }
  pGVar7 = Gia_ManObj(p->pGia,iObj);
  uVar2 = (uint)*(undefined8 *)pGVar7;
  if ((uVar2 & 0x9fffffff) == 0x9fffffff) {
    pGVar1 = p->pGia;
    iVar3 = Gia_ObjCioId(pGVar7);
    if (iVar3 < pGVar1->vCis->nSize - pGVar1->nRegs) {
      iVar3 = Gia_ObjCioId(pGVar7);
      Vec_IntPush(&p->vCiMap,iVar3);
      Vec_IntPush(&p->vCiMap,f);
      iVar3 = Gia_ManAppendCi(p->pFrames);
      goto LAB_0047d153;
    }
    if (0 < f) {
      if (((undefined1  [12])*pGVar7 & (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff
         ) {
        pGVar1 = p->pGia;
        iVar4 = Gia_ObjCioId(pGVar7);
        iVar3 = pGVar1->vCis->nSize;
        if (iVar3 - pGVar1->nRegs <= iVar4) {
          iVar4 = pGVar1->vCos->nSize;
          iVar5 = Gia_ObjCioId(pGVar7);
          pGVar7 = Gia_ManCo(pGVar1,(iVar4 - iVar3) + iVar5);
          iVar3 = Gia_ObjFaninId0p(p->pGia,pGVar7);
          iVar3 = Bmcg_ManUnfold_rec(p,iVar3,f + -1);
          iVar3 = Abc_LitNotCond(iVar3,*(uint *)pGVar7 >> 0x1d & 1);
          goto LAB_0047d153;
        }
      }
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
    }
  }
  else {
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcG.c"
                    ,0xa0,"int Bmcg_ManUnfold_rec(Bmcg_Man_t *, int, int)");
    }
    iVar3 = Bmcg_ManUnfold_rec(p,iObj - (uVar2 & 0x1fffffff),f);
    iVar3 = Abc_LitNotCond(iVar3,*(uint *)pGVar7 >> 0x1d & 1);
    if (iVar3 != 0) {
      iVar4 = Bmcg_ManUnfold_rec(p,iObj - (*(uint *)&pGVar7->field_0x4 & 0x1fffffff),f);
      iVar4 = Abc_LitNotCond(iVar4,(uint)((ulong)*(undefined8 *)pGVar7 >> 0x3d) & 1);
      iVar3 = Gia_ManHashAnd(p->pFrames,iVar3,iVar4);
      goto LAB_0047d153;
    }
  }
  iVar3 = 0;
LAB_0047d153:
  *(int *)((long)pvVar6 + (long)iObj * 4) = iVar3;
  return iVar3;
}

Assistant:

int Bmcg_ManUnfold_rec( Bmcg_Man_t * p, int iObj, int f )
{
    Gia_Obj_t * pObj; 
    int iLit = 0, * pCopies = Bmcg_ManCopies( p, f );
    if ( pCopies[iObj] >= 0 )
        return pCopies[iObj];
    pObj = Gia_ManObj( p->pGia, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            Vec_IntPushTwo( &p->vCiMap, Gia_ObjCioId(pObj), f );
            iLit = Gia_ManAppendCi( p->pFrames );
        }
        else if ( f > 0 )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            iLit = Bmcg_ManUnfold_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), f-1 );
            iLit = Abc_LitNotCond( iLit, Gia_ObjFaninC0(pObj) );
        }
    }
    else if ( Gia_ObjIsAnd(pObj) )
    {
        iLit = Bmcg_ManUnfold_rec( p, Gia_ObjFaninId0(pObj, iObj), f );
        iLit = Abc_LitNotCond( iLit, Gia_ObjFaninC0(pObj) );
        if ( iLit > 0 )
        {
            int iNew;
            iNew = Bmcg_ManUnfold_rec( p, Gia_ObjFaninId1(pObj, iObj), f );
            iNew = Abc_LitNotCond( iNew, Gia_ObjFaninC1(pObj) );
            iLit = Gia_ManHashAnd( p->pFrames, iLit, iNew );
        }
    }
    else assert( 0 );
    return (pCopies[iObj] = iLit);
}